

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O0

void __thiscall
slang::ast::ParameterBuilder::setAssignments
          (ParameterBuilder *this,ParameterValueAssignmentSyntax *syntax,bool isFromConfig)

{
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  Token TVar1;
  Token TVar2;
  string_view *psVar3;
  bool bVar4;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>
  *pSVar5;
  ulong uVar6;
  pointer ppVar7;
  size_type sVar8;
  pointer ppVar9;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  *this_00;
  try_emplace_args_t *args;
  type *ppNVar10;
  type_conflict1 *ptVar11;
  long lVar12;
  basic_string_view<char,_std::char_traits<char>_> *args_1;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> pVar13;
  string_view sVar14;
  Diagnostic *diag_3;
  type_conflict1 *used;
  type *argSyntax;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
  *pair_1;
  iterator __end3_2;
  iterator __begin3_2;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  *__range3_2;
  Diagnostic *diag_2;
  DiagCode code;
  NamedParamAssignmentSyntax *arg;
  iterator it;
  ParameterDecl *local_res3c0;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> *__range3_1;
  Diagnostic *diag_1;
  SourceLocation loc_2;
  ParameterDecl *param;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> *__range3;
  uint32_t orderedIndex;
  Diagnostic *diag;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  pair;
  string_view name;
  NamedParamAssignmentSyntax *nas;
  bool isOrdered;
  ParamAssignmentSyntax *paramBase;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *__range2;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  namedParams;
  SmallVector<const_slang::syntax::OrderedParamAssignmentSyntax_*,_5UL> orderedParams;
  bool orderedAssignments;
  bool hasParamAssignments;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc_3;
  size_t pos0_2;
  size_t hash_3;
  basic_string_view<char,_std::char_traits<char>_> *k_2;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  basic_string_view<char,_std::char_traits<char>_> *k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  uint n_3;
  value_type *p_3;
  value_type *elements_3;
  int mask_3;
  group_type *pg_3;
  size_t pos_3;
  prober pb_3;
  size_t hash_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff408;
  Diagnostic *in_stack_fffffffffffff410;
  SourceLocation in_stack_fffffffffffff418;
  Diagnostic *in_stack_fffffffffffff420;
  Token *this_01;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff428;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffff430;
  size_t in_stack_fffffffffffff438;
  undefined7 in_stack_fffffffffffff440;
  undefined1 in_stack_fffffffffffff447;
  undefined7 in_stack_fffffffffffff450;
  undefined1 in_stack_fffffffffffff457;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffff458;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff460;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff478;
  pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> *in_stack_fffffffffffff480;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff488;
  basic_string_view<char,_std::char_traits<char>_> *hash_00;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  *in_stack_fffffffffffff490;
  size_t in_stack_fffffffffffff498;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  *in_stack_fffffffffffff4a0;
  Scope *in_stack_fffffffffffff4b0;
  undefined7 in_stack_fffffffffffff4b8;
  undefined1 in_stack_fffffffffffff4bf;
  char_pointer in_stack_fffffffffffff4c0;
  DiagCode code_00;
  pair<const_slang::syntax::ExpressionSyntax_*,_bool> local_8a0;
  SourceLocation local_890;
  undefined4 local_884;
  SourceLocation local_880;
  undefined4 local_874;
  Diagnostic *local_870;
  undefined4 local_864;
  NamedParamAssignmentSyntax *local_860;
  iterator local_858;
  char_pointer local_848;
  table_element_pointer local_840;
  reference local_838;
  ParameterDecl *local_830;
  __normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
  local_828;
  long local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  SourceLocation local_800;
  undefined4 local_7f4;
  Diagnostic *local_7f0;
  Token local_7e8;
  SourceLocation local_7d8;
  pair<const_slang::syntax::ExpressionSyntax_*,_bool> local_7d0;
  reference local_7c0;
  ParameterDecl *local_7b8;
  __normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
  local_7b0;
  long local_7a8;
  uint local_79c;
  SourceLocation local_798;
  undefined4 local_78c;
  string_view local_788;
  SourceLocation local_778;
  undefined4 local_76c;
  Diagnostic *local_768;
  NamedParamAssignmentSyntax *local_760;
  undefined1 local_758;
  undefined1 local_749;
  NamedParamAssignmentSyntax *local_748;
  basic_string_view<char,_std::char_traits<char>_> local_740;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_730;
  string_view local_718;
  NamedParamAssignmentSyntax *local_708;
  OrderedParamAssignmentSyntax *local_700;
  Token local_6f8;
  SourceLocation local_6e8;
  undefined4 local_6e0;
  undefined1 local_6d9;
  SyntaxNode *local_6d8;
  const_iterator local_6d0;
  const_iterator local_6c0;
  long local_6b0;
  undefined1 local_590 [16];
  size_t local_580;
  ulong local_568;
  ulong local_560;
  SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*> local_550 [2];
  byte local_50b;
  byte local_50a;
  bool local_509;
  long local_508;
  basic_string_view<char,_std::char_traits<char>_> *local_4f8;
  string_view *local_4f0;
  undefined1 *local_4e8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_4e0;
  string_view *local_4c8;
  basic_string_view<char,_std::char_traits<char>_> *local_4c0;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_4b8;
  string_view *local_4a0;
  long local_498;
  string_view *local_490;
  undefined1 *local_488;
  char_pointer local_480;
  table_element_pointer local_478;
  undefined1 local_469;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  local_468;
  basic_string_view<char,_std::char_traits<char>_> *local_460;
  basic_string_view<char,_std::char_traits<char>_> *local_458;
  undefined1 *local_450;
  bool local_441 [25];
  iterator local_428;
  bool local_411 [25];
  iterator local_3f8;
  bool local_3e1;
  iterator local_3e0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>
  local_3d0;
  size_t local_3b8;
  size_t local_3b0;
  basic_string_view<char,_std::char_traits<char>_> *local_3a8;
  basic_string_view<char,_std::char_traits<char>_> *local_3a0;
  basic_string_view<char,_std::char_traits<char>_> *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  uint local_37c;
  value_type *local_378;
  value_type *local_370;
  uint local_364;
  group_type *local_360;
  size_t local_358;
  pow2_quadratic_prober local_350;
  size_t local_340;
  size_t local_338;
  basic_string_view<char,_std::char_traits<char>_> *local_330;
  undefined1 *local_328;
  undefined1 local_319;
  string_view *local_318;
  long local_310;
  undefined1 local_301;
  string_view *local_300;
  basic_string_view<char,_std::char_traits<char>_> *local_2f8;
  bool local_2e9 [25];
  iterator local_2d0;
  bool local_2b9 [25];
  iterator local_2a0;
  bool local_289;
  iterator local_288;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
  local_278;
  try_emplace_args_t *local_260;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  *local_258;
  basic_string_view<char,_std::char_traits<char>_> *local_250;
  string_view *local_248;
  undefined1 *local_240;
  basic_string_view<char,_std::char_traits<char>_> *local_238;
  bool local_229 [25];
  iterator local_210;
  bool local_1f9 [25];
  iterator local_1e0;
  bool local_1c9;
  iterator local_1c8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
  local_1b8;
  size_t local_1a0;
  size_t local_198;
  basic_string_view<char,_std::char_traits<char>_> *local_190;
  string_view *local_188;
  undefined1 *local_180;
  long local_178;
  uint local_16c;
  value_type *local_168;
  value_type *local_160;
  uint local_154;
  group_type *local_150;
  size_t local_148;
  pow2_quadratic_prober local_140;
  size_t local_130;
  size_t local_128;
  basic_string_view<char,_std::char_traits<char>_> *local_120;
  long local_118;
  uint local_10c;
  value_type *local_108;
  value_type *local_100;
  uint local_f4;
  group_type *local_f0;
  size_t local_e8;
  pow2_quadratic_prober local_e0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  *local_d0;
  try_emplace_args_t *local_c8;
  basic_string_view<char,_std::char_traits<char>_> *local_c0;
  basic_string_view<char,_std::char_traits<char>_> *local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>
  local_b0;
  string_view *local_98;
  undefined1 *local_90;
  iterator local_88;
  size_t local_78;
  string_view *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  string_view *local_10;
  undefined1 *local_8;
  
  local_509 = (bool)(in_DL & 1);
  local_508 = in_RSI;
  if ((local_509 == false) ||
     (bVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::empty
                        ((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)0x93b84d),
     !bVar4)) {
    local_50a = 0;
    local_50b = 1;
    SmallVector<const_slang::syntax::OrderedParamAssignmentSyntax_*,_5UL>::SmallVector
              ((SmallVector<const_slang::syntax::OrderedParamAssignmentSyntax_*,_5UL> *)0x93b88d);
    SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
    ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                *)in_stack_fffffffffffff420);
    local_6b0 = local_508 + 0x38;
    local_6c0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::begin
                          ((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)0x93b8bd);
    local_6d0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::end
                          ((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)0x93b8fc);
    while( true ) {
      bVar4 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<const_slang::syntax::ParamAssignmentSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffff410,
                         (iterator_base<const_slang::syntax::ParamAssignmentSyntax_*> *)
                         in_stack_fffffffffffff408);
      TVar1.info = local_6f8.info;
      TVar1.kind = local_6f8.kind;
      TVar1._2_1_ = local_6f8._2_1_;
      TVar1.numFlags.raw = local_6f8.numFlags.raw;
      TVar1.rawLen = local_6f8.rawLen;
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      local_6d8 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<const_slang::syntax::ParamAssignmentSyntax_*>,_false>
                   ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<const_slang::syntax::ParamAssignmentSyntax_*>,_false>
                                *)0x93b96b)->super_SyntaxNode;
      local_6d9 = local_6d8->kind == OrderedParamAssignment;
      if ((local_50a & 1) == 0) {
        local_50a = 1;
        local_50b = local_6d9;
      }
      else if (local_6d9 != (local_50b & 1)) {
        local_6e0 = 0x7f0006;
        local_6f8 = slang::syntax::SyntaxNode::getFirstToken
                              ((SyntaxNode *)
                               CONCAT17(in_stack_fffffffffffff447,in_stack_fffffffffffff440));
        local_6e8 = parsing::Token::location(&local_6f8);
        location._7_1_ = in_stack_fffffffffffff4bf;
        location._0_7_ = in_stack_fffffffffffff4b8;
        Scope::addDiag(in_stack_fffffffffffff4b0,SUB84((ulong)in_stack_fffffffffffff4c0 >> 0x20,0),
                       location);
        TVar1 = local_6f8;
        break;
      }
      if ((bool)local_6d9) {
        local_700 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>
                              (local_6d8);
        SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*>::push_back
                  ((SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*> *)
                   in_stack_fffffffffffff410,
                   (OrderedParamAssignmentSyntax **)in_stack_fffffffffffff408);
      }
      else {
        local_708 = slang::syntax::SyntaxNode::as<slang::syntax::NamedParamAssignmentSyntax>
                              (local_6d8);
        sVar14 = parsing::Token::valueText((Token *)in_stack_fffffffffffff420);
        local_718 = sVar14;
        bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_718);
        if (!bVar4) {
          local_748 = local_708;
          local_749 = 0;
          pVar13 = std::make_pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>
                             ((NamedParamAssignmentSyntax **)in_stack_fffffffffffff410,
                              (bool *)in_stack_fffffffffffff408);
          local_760 = pVar13.first;
          local_758 = pVar13.second;
          local_4f0 = &local_718;
          local_4f8 = &local_740;
          local_740._M_len = (size_t)local_760;
          local_740._M_str._0_1_ = local_758;
          local_4e8 = local_590;
          local_460 = local_4f8;
          local_458 = local_4f0;
          local_450 = local_590;
          pSVar5 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                   ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                         *)0x93bc9a);
          boost::unordered::detail::foa::
          alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
          ::alloc_cted_or_fwded_key_type(&local_468,pSVar5,local_458);
          local_398 = boost::unordered::detail::foa::
                      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                      ::move_or_fwd(&local_468);
          local_390 = &local_469;
          local_3a0 = local_460;
          local_388 = local_590;
          local_3a8 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                      ::
                      key_from<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
                                (local_398,local_460);
          local_3b0 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                      ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                  *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
          local_3b8 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                      ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                      *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408)
          ;
          local_330 = local_3a8;
          local_340 = local_3b0;
          local_338 = local_3b8;
          local_328 = local_590;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_350,local_3b8);
          do {
            local_358 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_350);
            local_360 = boost::unordered::detail::foa::
                        table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                        ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                  *)0x93be18);
            local_360 = local_360 + local_358;
            local_364 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::match
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_fffffffffffff418,(size_t)in_stack_fffffffffffff410);
            if (local_364 != 0) {
              local_370 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                          ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                      *)0x93be7a);
              local_378 = local_370 + local_358 * 0xf;
              do {
                local_37c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                        *)0x93becd);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                ::
                key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>
                          ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
                            *)0x93bf00);
                bVar4 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()(in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffff420);
                if (bVar4) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>
                  ::table_locator(&local_3d0,local_360,local_37c,local_378 + local_37c);
                  goto LAB_0093c01c;
                }
                local_364 = local_364 - 1 & local_364;
              } while (local_364 != 0);
            }
            bVar4 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408);
            if (bVar4) {
              memset(&local_3d0,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>
              ::table_locator(&local_3d0);
              goto LAB_0093c01c;
            }
            bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_350,local_580)
            ;
          } while (bVar4);
          memset(&local_3d0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>
          ::table_locator(&local_3d0);
LAB_0093c01c:
          bVar4 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                            ((table_locator *)&local_3d0);
          if (bVar4) {
            local_3e0 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                        ::make_iterator((locator *)0x93c03e);
            local_3e1 = false;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_730,&local_3e0,&local_3e1);
          }
          else if (local_560 < local_568) {
            in_stack_fffffffffffff408 = local_3a0;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
                      ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                        *)CONCAT17(in_stack_fffffffffffff447,in_stack_fffffffffffff440),
                       in_stack_fffffffffffff438,(size_t)in_stack_fffffffffffff430,
                       (try_emplace_args_t *)in_stack_fffffffffffff428,
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff420
                       ,(pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> *)
                        CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450));
            local_3f8 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                        ::make_iterator((locator *)0x93c0e0);
            local_411[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_730,&local_3f8,local_411);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
                      (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                       (try_emplace_args_t *)in_stack_fffffffffffff490,in_stack_fffffffffffff488,
                       in_stack_fffffffffffff480);
            local_428 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                        ::make_iterator((locator *)0x93c15b);
            local_441[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_730,&local_428,local_441);
          }
          if ((local_730.second & 1U) == 0) {
            local_76c = 0x320006;
            local_778 = parsing::Token::location(&local_708->name);
            location_00._7_1_ = in_stack_fffffffffffff4bf;
            location_00._0_7_ = in_stack_fffffffffffff4b8;
            local_768 = Scope::addDiag(in_stack_fffffffffffff4b0,
                                       SUB84((ulong)in_stack_fffffffffffff4c0 >> 0x20,0),location_00
                                      );
            arg_00._M_str = (char *)in_stack_fffffffffffff460;
            arg_00._M_len = (size_t)in_stack_fffffffffffff458;
            local_788 = local_718;
            Diagnostic::operator<<
                      ((Diagnostic *)CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450),
                       arg_00);
            local_78c = 0xc0001;
            ppVar9 = boost::unordered::detail::foa::
                     table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                   *)in_stack_fffffffffffff410);
            local_798 = parsing::Token::location(&((ppVar9->second).first)->name);
            Diagnostic::addNote(in_stack_fffffffffffff410,
                                SUB84((ulong)in_stack_fffffffffffff420 >> 0x20,0),
                                in_stack_fffffffffffff418);
          }
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<const_slang::syntax::ParamAssignmentSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<const_slang::syntax::ParamAssignmentSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<const_slang::syntax::ParamAssignmentSyntax_*>,_false>
                  *)in_stack_fffffffffffff410);
    }
    local_6f8 = TVar1;
    if ((local_50b & 1) == 0) {
      local_820 = in_RDI + 0x18;
      local_828._M_current =
           (ParameterDecl *)
           std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>::
           begin((span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> *)
                 in_stack_fffffffffffff408);
      local_830 = (ParameterDecl *)
                  std::
                  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>::
                  end((span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>
                       *)in_stack_fffffffffffff418);
      while( true ) {
        bVar4 = __gnu_cxx::
                operator==<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff410,
                           (__normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff408);
        if (((bVar4 ^ 0xffU) & 1) == 0) break;
        local_838 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
                    ::operator*(&local_828);
        local_490 = &local_838->name;
        local_488 = local_590;
        local_98 = local_490;
        local_90 = local_590;
        local_70 = local_490;
        local_68 = local_590;
        local_78 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                   ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                             ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                               *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
        psVar3 = local_70;
        local_18 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                   *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408);
        local_10 = psVar3;
        local_20 = local_78;
        local_8 = local_590;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_18);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                     ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                               *)0x93cc7b);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffff418,(size_t)in_stack_fffffffffffff410);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                       ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                   *)0x93ccdd);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                      *)0x93cd30);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
              ::
              key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>
                        ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
                          *)0x93cd63);
              bVar4 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()(in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffff420);
              if (bVar4) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>
                ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                goto LAB_0093ce7f;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          bVar4 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408);
          if (bVar4) {
            memset(&local_b0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>
            ::table_locator(&local_b0);
            goto LAB_0093ce7f;
          }
          bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,local_580);
        } while (bVar4);
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>
        ::table_locator(&local_b0);
LAB_0093ce7f:
        local_88 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                   ::make_iterator((locator *)0x93ce8e);
        local_480 = local_88.pc_;
        local_478 = local_88.p_;
        local_848 = local_88.pc_;
        local_840 = local_88.p_;
        in_stack_fffffffffffff4c0 = local_88.pc_;
        local_858 = boost::unordered::
                    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                    ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                           *)0x93cf2b);
        in_stack_fffffffffffff4bf =
             boost::unordered::detail::foa::operator==
                       ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)in_stack_fffffffffffff410,
                        (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)in_stack_fffffffffffff408);
        if (!(bool)in_stack_fffffffffffff4bf) {
          ppVar9 = boost::unordered::detail::foa::
                   table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)in_stack_fffffffffffff410);
          local_860 = (ppVar9->second).first;
          ppVar9 = boost::unordered::detail::foa::
                   table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)in_stack_fffffffffffff410);
          (ppVar9->second).second = true;
          if ((local_838->isLocalParam & 1U) == 0) {
            std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>::
            pair<slang::syntax::ExpressionSyntax_*const_&,_bool_&,_true>
                      (&local_8a0,&local_860->expr,&local_509);
            args_1 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x138);
            local_4c8 = &local_838->name;
            local_240 = &local_301;
            local_4c0 = args_1;
            local_300 = local_4c8;
            local_2f8 = args_1;
            local_248 = local_4c8;
            local_238 = args_1;
            local_250 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                        ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_4c8);
            this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                       *)boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                         ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                   ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                     *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
            local_258 = this_00;
            args = (try_emplace_args_t *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                   *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408);
            local_c0 = local_250;
            local_d0 = local_258;
            hash_00 = args_1;
            local_260 = args;
            local_c8 = args;
            local_b8 = args_1;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_e0,(size_t)args);
            do {
              local_e8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_e0);
              local_f0 = boost::unordered::detail::foa::
                         table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                         ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                   *)0x93d24c);
              local_f0 = local_f0 + local_e8;
              local_f4 = boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::match
                                   ((group15<boost::unordered::detail::foa::plain_integral> *)
                                    in_stack_fffffffffffff418,(size_t)in_stack_fffffffffffff410);
              if (local_f4 != 0) {
                local_100 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                            ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                        *)0x93d2a5);
                local_108 = local_100 + local_e8 * 0xf;
                do {
                  local_10c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  in_stack_fffffffffffff458 =
                       boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                       ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                               *)0x93d2f5);
                  in_stack_fffffffffffff460 = local_c0;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                  ::
                  key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>>
                            ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>
                              *)0x93d322);
                  bVar4 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                          operator()(in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_fffffffffffff420);
                  if (bVar4) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
                    ::table_locator(&local_278,local_f0,local_10c,local_108 + local_10c);
                    goto LAB_0093d429;
                  }
                  local_f4 = local_f4 - 1 & local_f4;
                } while (local_f4 != 0);
              }
              in_stack_fffffffffffff457 =
                   boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408);
              if ((bool)in_stack_fffffffffffff457) {
                memset(&local_278,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
                ::table_locator(&local_278);
                goto LAB_0093d429;
              }
              bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_e0,args_1[1]._M_len);
            } while (bVar4);
            memset(&local_278,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
            ::table_locator(&local_278);
LAB_0093d429:
            bVar4 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                              ((table_locator *)&local_278);
            if (bVar4) {
              local_288 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                          ::make_iterator((locator *)0x93d44b);
              local_289 = false;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_4e0,&local_288,&local_289);
            }
            else if ((char *)hash_00[3]._M_len < hash_00[2]._M_str) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                          *)CONCAT17(in_stack_fffffffffffff447,in_stack_fffffffffffff440),
                         in_stack_fffffffffffff438,(size_t)in_stack_fffffffffffff430,
                         (try_emplace_args_t *)in_stack_fffffffffffff428,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff420);
              local_2a0 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                          ::make_iterator((locator *)0x93d4db);
              local_2b9[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_4e0,&local_2a0,local_2b9);
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                        (this_00,(size_t)hash_00,args,args_1);
              local_2d0 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                          ::make_iterator((locator *)0x93d54e);
              local_2e9[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_4e0,&local_2d0,local_2e9);
            }
            ppVar7 = boost::unordered::detail::foa::
                     table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                   *)in_stack_fffffffffffff410);
            std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>::operator=
                      (&ppVar7->second,&local_8a0);
          }
          else {
            if ((local_838->isPortParam & 1U) == 0) {
              in_stack_fffffffffffff4b0 = (Scope *)&slang::diag::AssignedToLocalBodyParam;
            }
            else {
              in_stack_fffffffffffff4b0 = (Scope *)&slang::diag::AssignedToLocalPortParam;
            }
            local_874 = *(undefined4 *)&in_stack_fffffffffffff4b0->compilation;
            local_864 = local_874;
            local_880 = parsing::Token::location(&local_860->name);
            location_02._7_1_ = in_stack_fffffffffffff4bf;
            location_02._0_7_ = in_stack_fffffffffffff4b8;
            local_870 = Scope::addDiag(in_stack_fffffffffffff4b0,
                                       SUB84((ulong)in_stack_fffffffffffff4c0 >> 0x20,0),location_02
                                      );
            local_884 = 0x50001;
            local_890 = local_838->location;
            Diagnostic::addNote(in_stack_fffffffffffff410,
                                SUB84((ulong)in_stack_fffffffffffff420 >> 0x20,0),
                                in_stack_fffffffffffff418);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
        ::operator++(&local_828);
      }
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
      ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
               *)0x93d5e5);
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
      ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)0x93d609);
      sVar14._M_str = (char *)in_stack_fffffffffffff418;
      sVar14._M_len = (size_t)in_stack_fffffffffffff420;
      while( true ) {
        bVar4 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_fffffffffffff410,
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_fffffffffffff408);
        TVar2.info = local_7e8.info;
        TVar2.kind = local_7e8.kind;
        TVar2._2_1_ = local_7e8._2_1_;
        TVar2.numFlags.raw = local_7e8.numFlags.raw;
        TVar2.rawLen = local_7e8.rawLen;
        if (!bVar4) break;
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     *)0x93d64e);
        ppNVar10 = std::get<0ul,slang::syntax::NamedParamAssignmentSyntax_const*,bool>
                             ((pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> *)
                              0x93d683);
        ptVar11 = std::get<1ul,slang::syntax::NamedParamAssignmentSyntax_const*,bool>
                            ((pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> *)
                             0x93d698);
        if ((*ptVar11 & 1U) == 0) {
          parsing::Token::location(&(*ppNVar10)->name);
          this_01 = (Token *)sVar14._M_len;
          location_03._7_1_ = in_stack_fffffffffffff4bf;
          location_03._0_7_ = in_stack_fffffffffffff4b8;
          in_stack_fffffffffffff410 =
               Scope::addDiag(in_stack_fffffffffffff4b0,
                              SUB84((ulong)in_stack_fffffffffffff4c0 >> 0x20,0),location_03);
          sVar14 = parsing::Token::valueText(this_01);
          arg_02._M_str = (char *)in_stack_fffffffffffff460;
          arg_02._M_len = (size_t)in_stack_fffffffffffff458;
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450),
                     arg_02);
          arg_03._M_str = (char *)in_stack_fffffffffffff460;
          arg_03._M_len = (size_t)in_stack_fffffffffffff458;
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450),
                     arg_03);
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffff410);
      }
    }
    else {
      local_79c = 0;
      local_7a8 = in_RDI + 0x18;
      local_7b0._M_current =
           (ParameterDecl *)
           std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>::
           begin((span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> *)
                 in_stack_fffffffffffff408);
      local_7b8 = (ParameterDecl *)
                  std::
                  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>::
                  end((span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>
                       *)in_stack_fffffffffffff418);
      while( true ) {
        bVar4 = __gnu_cxx::
                operator==<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff410,
                           (__normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff408);
        code_00 = SUB84((ulong)in_stack_fffffffffffff4c0 >> 0x20,0);
        if (((bVar4 ^ 0xffU) & 1) == 0) break;
        local_7c0 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
                    ::operator*(&local_7b0);
        uVar6 = (ulong)local_79c;
        sVar8 = SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*>::size
                          (local_550);
        code_00 = SUB84((ulong)in_stack_fffffffffffff4c0 >> 0x20,0);
        if (sVar8 <= uVar6) break;
        if ((local_7c0->isLocalParam & 1U) == 0) {
          uVar6 = (ulong)local_79c;
          local_79c = local_79c + 1;
          SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*>::operator[]
                    (local_550,uVar6);
          std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>::
          pair<const_slang::not_null<slang::syntax::ExpressionSyntax_*>_&,_bool_&,_true>
                    ((pair<const_slang::syntax::ExpressionSyntax_*,_bool> *)
                     in_stack_fffffffffffff420,
                     (not_null<slang::syntax::ExpressionSyntax_*> *)in_stack_fffffffffffff418,
                     (bool *)in_stack_fffffffffffff410);
          lVar12 = in_RDI + 0x138;
          local_4a0 = &local_7c0->name;
          local_180 = &local_319;
          local_498 = lVar12;
          local_318 = local_4a0;
          local_310 = lVar12;
          local_188 = local_4a0;
          local_178 = lVar12;
          local_190 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                      ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_4a0);
          local_198 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                      ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                  *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
          local_1a0 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                      ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                      *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408)
          ;
          local_120 = local_190;
          local_130 = local_198;
          local_128 = local_1a0;
          local_118 = lVar12;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_140,local_1a0);
          do {
            local_148 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_140);
            local_150 = boost::unordered::detail::foa::
                        table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                        ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                  *)0x93c585);
            local_150 = local_150 + local_148;
            local_154 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::match
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_fffffffffffff418,(size_t)in_stack_fffffffffffff410);
            if (local_154 != 0) {
              local_160 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                          ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                      *)0x93c5e7);
              local_168 = local_160 + local_148 * 0xf;
              do {
                local_16c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                        *)0x93c63a);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                ::
                key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>>
                          ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>
                            *)0x93c66d);
                bVar4 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()(in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffff420);
                if (bVar4) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
                  ::table_locator(&local_1b8,local_150,local_16c,local_168 + local_16c);
                  goto LAB_0093c789;
                }
                local_154 = local_154 - 1 & local_154;
              } while (local_154 != 0);
            }
            bVar4 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408);
            if (bVar4) {
              memset(&local_1b8,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
              ::table_locator(&local_1b8);
              goto LAB_0093c789;
            }
            bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                              (&local_140,*(size_t *)(in_RDI + 0x148));
          } while (bVar4);
          memset(&local_1b8,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
          ::table_locator(&local_1b8);
LAB_0093c789:
          bVar4 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                            ((table_locator *)&local_1b8);
          if (bVar4) {
            local_1c8 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                        ::make_iterator((locator *)0x93c7ab);
            local_1c9 = false;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_4b8,&local_1c8,&local_1c9);
          }
          else if (*(ulong *)(in_RDI + 0x168) < *(ulong *)(in_RDI + 0x160)) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                      ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                        *)CONCAT17(in_stack_fffffffffffff447,in_stack_fffffffffffff440),
                       in_stack_fffffffffffff438,(size_t)in_stack_fffffffffffff430,
                       (try_emplace_args_t *)in_stack_fffffffffffff428,
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff420
                      );
            local_1e0 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                        ::make_iterator((locator *)0x93c83b);
            local_1f9[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_4b8,&local_1e0,local_1f9);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                      (in_stack_fffffffffffff490,(size_t)in_stack_fffffffffffff488,
                       (try_emplace_args_t *)in_stack_fffffffffffff480,in_stack_fffffffffffff478);
            local_210 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                        ::make_iterator((locator *)0x93c8ae);
            local_229[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_4b8,&local_210,local_229);
          }
          ppVar7 = boost::unordered::detail::foa::
                   table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)in_stack_fffffffffffff410);
          std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>::operator=
                    (&ppVar7->second,&local_7d0);
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::DefinitionSymbol::ParameterDecl_*,_std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>_>
        ::operator++(&local_7b0);
      }
      uVar6 = (ulong)local_79c;
      sVar8 = SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*>::size(local_550);
      TVar2.info = local_7e8.info;
      TVar2.kind = local_7e8.kind;
      TVar2._2_1_ = local_7e8._2_1_;
      TVar2.numFlags.raw = local_7e8.numFlags.raw;
      TVar2.rawLen = local_7e8.rawLen;
      if (uVar6 < sVar8) {
        SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*>::operator[]
                  (local_550,(ulong)local_79c);
        local_7e8 = slang::syntax::SyntaxNode::getFirstToken
                              ((SyntaxNode *)
                               CONCAT17(in_stack_fffffffffffff447,in_stack_fffffffffffff440));
        local_800 = parsing::Token::location(&local_7e8);
        local_7f4 = 0xc70006;
        location_01._7_1_ = in_stack_fffffffffffff4bf;
        location_01._0_7_ = in_stack_fffffffffffff4b8;
        local_7d8 = local_800;
        local_7f0 = Scope::addDiag(in_stack_fffffffffffff4b0,code_00,location_01);
        local_818 = *(undefined8 *)(in_RDI + 8);
        uStack_810 = *(undefined8 *)(in_RDI + 0x10);
        arg_01._M_str = (char *)in_stack_fffffffffffff460;
        arg_01._M_len = (size_t)in_stack_fffffffffffff458;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450),
                   arg_01);
        SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*>::size(local_550);
        Diagnostic::operator<<<unsigned_long>
                  (in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
        Diagnostic::operator<<<unsigned_int>
                  (in_stack_fffffffffffff420,in_stack_fffffffffffff418._4_4_);
        TVar2 = local_7e8;
      }
    }
    local_7e8 = TVar2;
    SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
    ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                 *)0x93d7dc);
    SmallVector<const_slang::syntax::OrderedParamAssignmentSyntax_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::syntax::OrderedParamAssignmentSyntax_*,_5UL> *)0x93d7e9);
  }
  else {
    boost::unordered::
    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
    ::clear((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)0x93b86b);
  }
  return;
}

Assistant:

void ParameterBuilder::setAssignments(const ParameterValueAssignmentSyntax& syntax,
                                      bool isFromConfig) {
    // Special case for config param assignments: if the assignment
    // syntax list is empty, we set all params back to their defaults.
    if (isFromConfig && syntax.parameters.empty()) {
        assignments.clear();
        return;
    }

    // Build up data structures to easily index the parameter assignments. We need to handle
    // both ordered assignment as well as named assignment, though a specific instance can only
    // use one method or the other.
    bool hasParamAssignments = false;
    bool orderedAssignments = true;
    SmallVector<const OrderedParamAssignmentSyntax*> orderedParams;
    SmallMap<std::string_view, std::pair<const NamedParamAssignmentSyntax*, bool>, 8> namedParams;

    for (auto paramBase : syntax.parameters) {
        bool isOrdered = paramBase->kind == SyntaxKind::OrderedParamAssignment;
        if (!hasParamAssignments) {
            hasParamAssignments = true;
            orderedAssignments = isOrdered;
        }
        else if (isOrdered != orderedAssignments) {
            scope.addDiag(diag::MixingOrderedAndNamedParams, paramBase->getFirstToken().location());
            break;
        }

        if (isOrdered)
            orderedParams.push_back(&paramBase->as<OrderedParamAssignmentSyntax>());
        else {
            auto& nas = paramBase->as<NamedParamAssignmentSyntax>();
            auto name = nas.name.valueText();
            if (!name.empty()) {
                auto pair = namedParams.emplace(name, std::make_pair(&nas, false));
                if (!pair.second) {
                    auto& diag = scope.addDiag(diag::DuplicateParamAssignment, nas.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
    }

    // For each parameter assignment we have, match it up to a real parameter
    if (orderedAssignments) {
        uint32_t orderedIndex = 0;
        for (auto& param : parameterDecls) {
            if (orderedIndex >= orderedParams.size())
                break;

            if (param.isLocalParam)
                continue;

            assignments[param.name] = {orderedParams[orderedIndex++]->expr, isFromConfig};
        }

        // Make sure there aren't extra param assignments for non-existent params.
        if (orderedIndex < orderedParams.size()) {
            auto loc = orderedParams[orderedIndex]->getFirstToken().location();
            auto& diag = scope.addDiag(diag::TooManyParamAssignments, loc);
            diag << definitionName;
            diag << orderedParams.size();
            diag << orderedIndex;
        }
    }
    else {
        // Otherwise handle named assignments.
        for (auto& param : parameterDecls) {
            auto it = namedParams.find(param.name);
            if (it == namedParams.end())
                continue;

            auto arg = it->second.first;
            it->second.second = true;
            if (param.isLocalParam) {
                // Can't assign to localparams, so this is an error.
                DiagCode code = param.isPortParam ? diag::AssignedToLocalPortParam
                                                  : diag::AssignedToLocalBodyParam;

                auto& diag = scope.addDiag(code, arg->name.location());
                diag.addNote(diag::NoteDeclarationHere, param.location);
                continue;
            }

            assignments[param.name] = {arg->expr, isFromConfig};
        }

        for (auto& pair : namedParams) {
            // We marked all the args that we used, so anything left over is a param assignment
            // for a non-existent parameter.
            auto [argSyntax, used] = pair.second;
            if (!used) {
                auto& diag = scope.addDiag(diag::ParameterDoesNotExist, argSyntax->name.location());
                diag << argSyntax->name.valueText();
                diag << definitionName;
            }
        }
    }
}